

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int vcf_write(htsFile *fp,bcf_hdr_t *h,bcf1_t *v)

{
  int iVar1;
  ssize_t sVar2;
  int local_24;
  int ret;
  bcf1_t *v_local;
  bcf_hdr_t *h_local;
  htsFile *fp_local;
  
  (fp->line).l = 0;
  vcf_format(h,v,&fp->line);
  if ((fp->format).compression == no_compression) {
    sVar2 = hwrite((fp->fp).hfile,(fp->line).s,(fp->line).l);
    local_24 = (int)sVar2;
  }
  else {
    sVar2 = bgzf_write((fp->fp).bgzf,(fp->line).s,(fp->line).l);
    local_24 = (int)sVar2;
  }
  iVar1 = -1;
  if ((long)local_24 == (fp->line).l) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int vcf_write(htsFile *fp, const bcf_hdr_t *h, bcf1_t *v)
{
    int ret;
    fp->line.l = 0;
    vcf_format1(h, v, &fp->line);
    if ( fp->format.compression!=no_compression )
        ret = bgzf_write(fp->fp.bgzf, fp->line.s, fp->line.l);
    else
        ret = hwrite(fp->fp.hfile, fp->line.s, fp->line.l);
    return ret==fp->line.l ? 0 : -1;
}